

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dlep_extension.c
# Opt level: O2

oonf_layer2_neigh * dlep_extension_get_l2_neighbor(dlep_session *session)

{
  char *pcVar1;
  int iVar2;
  avl_tree *paVar3;
  long lVar4;
  oonf_layer2_neigh_key key;
  oonf_layer2_neigh_key local_2b;
  
  iVar2 = dlep_extension_get_l2_neighbor_key(&local_2b,session);
  if (iVar2 == 0) {
    pcVar1 = (session->l2_listener).name;
    paVar3 = oonf_layer2_get_net_tree();
    lVar4 = avl_find(paVar3,pcVar1);
    if (lVar4 != 0) {
      lVar4 = avl_find(lVar4 + -0x710,&local_2b);
      if (lVar4 != 0) {
        return (oonf_layer2_neigh *)(lVar4 + -0x4c0);
      }
      return (oonf_layer2_neigh *)0x0;
    }
  }
  return (oonf_layer2_neigh *)0x0;
}

Assistant:

struct oonf_layer2_neigh *
dlep_extension_get_l2_neighbor(struct dlep_session *session) {
  struct oonf_layer2_net *l2net;

  struct oonf_layer2_neigh_key key;

  if (dlep_extension_get_l2_neighbor_key(&key, session)) {
    return NULL;
  }

  l2net = oonf_layer2_net_get(session->l2_listener.name);
  if (!l2net) {
    return NULL;
  }
  return oonf_layer2_neigh_get_lid(l2net, &key);
}